

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *this_00;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *this_01;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *this_02;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *this_03;
  size_t *psVar1;
  undefined8 *puVar2;
  _Rb_tree_header *p_Var3;
  pointer puVar4;
  unsigned_long uVar5;
  HalfedgeMesh *pHVar6;
  HalfedgeMesh *pHVar7;
  _List_node_base *p_Var8;
  pointer pVVar9;
  undefined8 uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar13;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar14;
  _Self __tmp;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  iterator iVar17;
  _Base_ptr p_Var18;
  mapped_type *pmVar19;
  _Base_ptr p_Var20;
  long lVar21;
  FaceIter FVar22;
  _List_node_base *p_Var23;
  _List_node_base *p_Var24;
  ostream *poVar25;
  _Rb_tree_header *p_Var26;
  ulong uVar27;
  long lVar28;
  HalfedgeMesh *pHVar29;
  pointer pvVar30;
  pointer pvVar31;
  mapped_type mVar32;
  pointer puVar33;
  long lVar34;
  bool bVar35;
  HalfedgeIter hab;
  VertexIter v;
  IndexPair ab;
  Index a;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  IndexPair ba;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  _List_iterator<CMU462::Halfedge> local_160;
  key_type local_158;
  iterator iStack_150;
  _List_iterator<CMU462::Halfedge> *local_148;
  HalfedgeMesh *local_140;
  _List_node_base *local_138;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_130;
  key_type local_128;
  _List_node_base *local_118;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_110;
  _List_node_base *local_108;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_100;
  long local_f8;
  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  local_f0;
  pointer local_c0;
  pointer local_b8;
  long local_b0;
  pointer local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  local_a0;
  key_type local_70;
  _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  local_60;
  
  local_110 = vertexPositions;
  std::__cxx11::_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::_M_clear
            ((_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)this);
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node._M_size = 0;
  this_00 = &this->vertices;
  std::__cxx11::_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::_M_clear
            (&this_00->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>);
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  ._M_size = 0;
  this_01 = &this->edges;
  local_108 = (_List_node_base *)this_00;
  std::__cxx11::_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>::_M_clear
            (&this_01->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>);
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  _M_size = 0;
  this_02 = &this->faces;
  local_100 = this_01;
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&this_02->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_02;
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_02;
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  this_03 = &this->boundaries;
  local_138 = (_List_node_base *)this_02;
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&this_03->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar31 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar30 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_130 = polygons;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar31 != pvVar30) {
    do {
      if ((ulong)((long)(pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start) < 0x11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                   ,0x5b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017ce99;
      }
      local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_f0._M_impl.super__Rb_tree_header._M_header;
      local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar33 = (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          puVar4 = (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish, puVar33 != puVar4;
          puVar33 = puVar33 + 1) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_f0,puVar33);
        p_Var18 = &local_a0._M_impl.super__Rb_tree_header._M_header;
        if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var20 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(ulong *)(p_Var20 + 1) >= *puVar33) {
              p_Var18 = p_Var20;
            }
            p_Var20 = (&p_Var20->_M_left)[*(ulong *)(p_Var20 + 1) < *puVar33];
          } while (p_Var20 != (_Base_ptr)0x0);
        }
        p_Var3 = &local_a0._M_impl.super__Rb_tree_header;
        p_Var26 = p_Var3;
        if (((_Rb_tree_header *)p_Var18 != p_Var3) &&
           (p_Var26 = (_Rb_tree_header *)p_Var18,
           *puVar33 < ((_Rb_tree_header *)p_Var18)->_M_node_count)) {
          p_Var26 = p_Var3;
        }
        if (p_Var26 == p_Var3) {
          local_158._M_node = (_List_node_base *)newVertex(this);
          local_158._M_node[0xf]._M_prev = (_List_node_base *)this;
          pmVar15 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_a0,puVar33);
          pmVar15->_M_node = local_158._M_node;
          pmVar16 = std::
                    map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                  *)&local_60,&local_158);
          *pmVar16 = 1;
        }
        else {
          pmVar15 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_a0,puVar33);
          pmVar16 = std::
                    map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                  *)&local_60,pmVar15);
          *pmVar16 = *pmVar16 + 1;
        }
      }
      if (local_f0._M_impl.super__Rb_tree_header._M_node_count <
          (ulong)((long)puVar4 -
                  (long)(pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                   ,0x66);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(vertex indices:",0x10);
        puVar33 = (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar33 !=
            (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            puVar33 = puVar33 + 1;
          } while (puVar33 !=
                   (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")",1);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017ce99;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_f0);
      pvVar31 = pvVar31 + 1;
      pvVar30 = (local_130->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (pvVar31 != pvVar30);
  }
  pvVar13 = local_130;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_138,
             ((long)pvVar30 -
              (long)(local_130->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar31 = (pvVar13->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_140 = this;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar31 !=
      (pvVar13->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_138 = local_138->_M_next;
      local_158._M_node = (_List_node_base *)0x0;
      iStack_150._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_148 = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_b8 = (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      local_c0 = (pvVar31->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar28 = (long)local_c0 - (long)local_b8 >> 3;
      if (local_c0 != local_b8) {
        local_b0 = -(ulong)(lVar28 == 0) - lVar28;
        lVar34 = 1;
        local_f8 = lVar28;
        local_a8 = pvVar31;
        do {
          puVar33 = (local_a8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          local_128.first = puVar33[lVar34 + -1];
          lVar21 = 0;
          if (lVar28 != lVar34) {
            lVar21 = lVar34;
          }
          uVar5 = puVar33[lVar21];
          local_160._M_node = (_List_node_base *)0x0;
          local_128.second = uVar5;
          local_118 = (_List_node_base *)local_128.first;
          iVar17 = std::
                   _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   ::find(&local_f0,&local_128);
          if ((_Rb_tree_header *)iVar17._M_node != &local_f0._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                       ,0x58);
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
            std::__ostream_insert<char,std::char_traits<char>>(poVar25,").",2);
            std::endl<char,std::char_traits<char>>(poVar25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                       ,0x67);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                       ,0x6f);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"not consistently oriented.",0x1a);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_0017ce99;
          }
          p_Var18 = (_Base_ptr)operator_new(0x40);
          pHVar6 = local_140;
          p_Var18->_M_left = (_Base_ptr)&PTR_centroid_00266d48;
          p_Var18->_M_right = (_Base_ptr)0x0;
          *(_List_node_base **)&p_Var18[1]._M_color = (_List_node_base *)0x0;
          p_Var18[1]._M_parent = (_Base_ptr)0x0;
          p_Var18[1]._M_left = (_Base_ptr)0x0;
          p_Var18[1]._M_right = (_Base_ptr)0x0;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var18);
          psVar1 = &(pHVar6->halfedges).
                    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_160._M_node = (_List_node_base *)p_Var18;
          pmVar19 = std::
                    map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                    ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                                  *)&local_f0,&local_128);
          pmVar19->_M_node = local_160._M_node;
          local_160._M_node[3]._M_prev = local_138;
          local_138[0xb]._M_prev = local_160._M_node;
          pmVar15 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_a0,(key_type_conflict1 *)&local_118);
          p_Var18 = (_Base_ptr)pmVar15->_M_node;
          ((_Base_ptr)(local_160._M_node + 2))->_M_parent = p_Var18;
          p_Var18[7]._M_right = (_Base_ptr)local_160._M_node;
          if (iStack_150._M_current == local_148) {
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
            ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                      ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                        *)&local_158,iStack_150,&local_160);
          }
          else {
            (iStack_150._M_current)->_M_node = local_160._M_node;
            iStack_150._M_current = iStack_150._M_current + 1;
          }
          local_70.second = (unsigned_long)local_118;
          local_70.first = uVar5;
          iVar17 = std::
                   _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   ::find(&local_f0,&local_70);
          if ((_Rb_tree_header *)iVar17._M_node == &local_f0._M_impl.super__Rb_tree_header) {
            local_160._M_node[1]._M_prev = (_List_node_base *)local_140;
            lVar28 = local_f8;
          }
          else {
            p_Var18 = iVar17._M_node[1]._M_left;
            local_160._M_node[1]._M_prev = (_List_node_base *)p_Var18;
            p_Var18->_M_right = (_Base_ptr)local_160._M_node;
            p_Var20 = (_Base_ptr)operator_new(0x70);
            lVar28 = local_f8;
            p_Var20->_M_left = (_Base_ptr)&PTR_centroid_00266e08;
            *(undefined8 *)&p_Var20[2]._M_color = 0;
            p_Var20[2]._M_parent = (_Base_ptr)0x0;
            p_Var20[2]._M_left = (_Base_ptr)0x0;
            p_Var20[2]._M_right = (_Base_ptr)0x0;
            *(undefined8 *)&p_Var20[3]._M_color = 0;
            p_Var20[3]._M_parent = (_Base_ptr)0x0;
            p_Var20->_M_right = (_Base_ptr)0x0;
            *(undefined8 *)&p_Var20[1]._M_color = 0;
            p_Var20[1]._M_parent = (_Base_ptr)0x0;
            p_Var20[1]._M_left = (_Base_ptr)0x0;
            *(undefined1 *)&p_Var20[1]._M_right = 0;
            std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var20);
            psVar1 = &(local_140->edges).
                      super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
                      _M_size;
            *psVar1 = *psVar1 + 1;
            local_160._M_node[3]._M_next = (_List_node_base *)p_Var20;
            p_Var18[1]._M_left = p_Var20;
            p_Var20[3]._M_parent = (_Base_ptr)local_160._M_node;
          }
          lVar21 = local_b0 + lVar34;
          lVar34 = lVar34 + 1;
          pvVar31 = local_a8;
        } while (lVar21 != 0);
      }
      pvVar13 = local_130;
      this = local_140;
      if (local_c0 != local_b8) {
        lVar34 = 1;
        do {
          lVar21 = 0;
          if (lVar28 != lVar34) {
            lVar21 = lVar34;
          }
          *(_List_node_base **)(*(long *)((long)local_158._M_node + lVar34 * 8 + -8) + 0x20) =
               (&(local_158._M_node)->_M_next)[lVar21];
          lVar21 = (-(ulong)(lVar28 == 0) - lVar28) + lVar34;
          lVar34 = lVar34 + 1;
        } while (lVar21 != 0);
      }
      if (local_158._M_node != (_List_node_base *)0x0) {
        operator_delete(local_158._M_node,(long)local_148 - (long)local_158._M_node);
      }
      pvVar31 = pvVar31 + 1;
    } while (pvVar31 !=
             (pvVar13->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  for (p_Var23 = local_108->_M_next; p_Var23 != local_108; p_Var23 = p_Var23->_M_next) {
    p_Var24 = p_Var23[0xf]._M_prev;
    do {
      if ((HalfedgeMesh *)p_Var24[1]._M_prev == this) {
        p_Var23[0xf]._M_prev = p_Var24;
        break;
      }
      p_Var24 = (((HalfedgeMesh *)p_Var24[1]._M_prev)->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_prev;
    } while (p_Var23[0xf]._M_prev != p_Var24);
  }
  p_Var23 = local_108;
  for (pHVar6 = (HalfedgeMesh *)
                (this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node.super__List_node_base._M_next; pHVar6 != this;
      pHVar6 = (HalfedgeMesh *)
               (pHVar6->halfedges).
               super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node
               .super__List_node_base._M_next) {
    if ((HalfedgeMesh *)
        (pHVar6->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl
        ._M_node.super__List_node_base._M_next == this) {
      FVar22 = newBoundary(this);
      local_158._M_node = (_List_node_base *)0x0;
      iStack_150._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_148 = (_List_iterator<CMU462::Halfedge> *)0x0;
      pHVar29 = pHVar6;
      do {
        p_Var23 = (_List_node_base *)operator_new(0x40);
        p_Var23[1]._M_next = (_List_node_base *)&PTR_centroid_00266d48;
        p_Var23[1]._M_prev = (_List_node_base *)0x0;
        p_Var23[2]._M_next = (_List_node_base *)0x0;
        p_Var23[2]._M_prev = (_List_node_base *)0x0;
        p_Var23[3]._M_next = (_List_node_base *)0x0;
        p_Var23[3]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var23);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_128.first = (unsigned_long)p_Var23;
        if (iStack_150._M_current == local_148) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)&local_158,iStack_150,(_List_iterator<CMU462::Halfedge> *)&local_128);
        }
        else {
          (iStack_150._M_current)->_M_node = p_Var23;
          iStack_150._M_current = iStack_150._M_current + 1;
        }
        (pHVar29->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_128.first;
        ((_List_node_base *)(local_128.first + 0x10))->_M_prev = (_List_node_base *)pHVar29;
        ((_List_node_base *)(local_128.first + 0x30))->_M_prev = FVar22._M_node;
        ((_List_node_base *)(local_128.first + 0x20))->_M_prev =
             (pHVar29->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
             _M_impl._M_node.super__List_node_base._M_prev[2]._M_prev;
        p_Var24 = (_List_node_base *)operator_new(0x70);
        p_Var24[1]._M_next = (_List_node_base *)&PTR_centroid_00266e08;
        p_Var24[4]._M_next = (_List_node_base *)0x0;
        p_Var24[4]._M_prev = (_List_node_base *)0x0;
        p_Var24[5]._M_next = (_List_node_base *)0x0;
        p_Var24[5]._M_prev = (_List_node_base *)0x0;
        p_Var24[6]._M_next = (_List_node_base *)0x0;
        p_Var24[6]._M_prev = (_List_node_base *)0x0;
        p_Var24[1]._M_prev = (_List_node_base *)0x0;
        p_Var24[2]._M_next = (_List_node_base *)0x0;
        p_Var24[2]._M_prev = (_List_node_base *)0x0;
        p_Var24[3]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var24[3]._M_prev = 0;
        std::__detail::_List_node_base::_M_hook(p_Var24);
        p_Var23 = local_108;
        psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var24[6]._M_prev = (_List_node_base *)pHVar29;
        (pHVar29->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
        _M_node.super__List_node_base._M_next = p_Var24;
        ((_List_node_base *)(local_128.first + 0x30))->_M_next = p_Var24;
        pHVar29 = (HalfedgeMesh *)
                  (pHVar29->vertices).
                  super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                  super__List_node_base._M_prev;
        bVar35 = pHVar6 == pHVar29;
        if (bVar35) break;
        pHVar7 = (HalfedgeMesh *)
                 (pHVar29->vertices).
                 super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        while (pHVar7 != this) {
          pHVar29 = (HalfedgeMesh *)
                    (pHVar29->vertices).
                    super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                    _M_node.super__List_node_base._M_next[2]._M_next;
          bVar35 = pHVar6 == pHVar29;
          if (bVar35) goto LAB_0017caee;
          pHVar7 = (HalfedgeMesh *)
                   (pHVar29->vertices).
                   super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
                   .super__List_node_base._M_next;
        }
      } while (!bVar35);
LAB_0017caee:
      FVar22._M_node[0xb]._M_prev = (local_158._M_node)->_M_next;
      if ((long)iStack_150._M_current - (long)local_158._M_node != 0) {
        uVar27 = (long)iStack_150._M_current - (long)local_158._M_node >> 3;
        lVar28 = 0;
        do {
          (&(local_158._M_node)->_M_next)[lVar28][2]._M_next =
               (&(local_158._M_node)->_M_next)[((uVar27 - 1) + lVar28) % uVar27];
          lVar28 = lVar28 + 1;
        } while (uVar27 + (uVar27 == 0) != lVar28);
      }
      operator_delete(local_158._M_node,(long)local_148 - (long)local_158._M_node);
    }
  }
  p_Var24 = p_Var23->_M_next;
  while (p_Var24 != p_Var23) {
    p_Var8 = p_Var24->_M_next;
    p_Var24[0xf]._M_prev = p_Var24[0xf]._M_prev[1]._M_prev[2]._M_next;
    p_Var24 = p_Var8;
  }
  local_158._M_node = p_Var23->_M_next;
  if (local_158._M_node != p_Var23) {
    do {
      if ((HalfedgeMesh *)local_158._M_node[0xf]._M_prev == this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                   ,0x5c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017ce99;
      }
      mVar32 = 0;
      p_Var24 = local_158._M_node[0xf]._M_prev;
      do {
        mVar32 = mVar32 + ((ulong)*(byte *)&p_Var24[3]._M_prev[0xc]._M_next ^ 1);
        p_Var24 = p_Var24[1]._M_prev[2]._M_next;
      } while (local_158._M_node[0xf]._M_prev != p_Var24);
      pmVar16 = std::
                map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                              *)&local_60,&local_158);
      if (mVar32 != *pmVar16) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                   ,0x58);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017ce99;
      }
      local_158._M_node = (local_158._M_node)->_M_next;
    } while (local_158._M_node != p_Var23);
  }
  pvVar14 = local_110;
  if ((this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node._M_size <=
      (ulong)(((long)(local_110->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_110->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    p_Var3 = &local_a0._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
      lVar28 = 0;
      p_Var18 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var20 = p_Var18[1]._M_parent;
        pVVar9 = (pvVar14->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        p_Var20[1]._M_parent = *(_Base_ptr *)((long)&pVVar9->z + lVar28);
        puVar2 = (undefined8 *)((long)&pVVar9->x + lVar28);
        uVar10 = puVar2[1];
        p_Var20->_M_right = (_Base_ptr)*puVar2;
        *(undefined8 *)(p_Var20 + 1) = uVar10;
        puVar2 = (undefined8 *)((long)&pVVar9->x + lVar28);
        p_Var11 = (_Base_ptr)*puVar2;
        p_Var12 = (_Base_ptr)puVar2[1];
        *(undefined8 *)(p_Var20 + 2) = *(undefined8 *)((long)&pVVar9->z + lVar28);
        p_Var20[1]._M_left = p_Var11;
        p_Var20[1]._M_right = p_Var12;
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        lVar28 = lVar28 + 0x18;
      } while ((_Rb_tree_header *)p_Var18 != p_Var3);
    }
    std::
    _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::~_Rb_tree(&local_f0);
    std::
    _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
    ::~_Rb_tree(&local_a0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
             ,0x79);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(number of positions in input: ",0x1f);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
  std::endl<char,std::char_traits<char>>(poVar25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(  number of vertices in mesh: ",0x1f);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
  std::endl<char,std::char_traits<char>>(poVar25);
LAB_0017ce99:
  exit(1);
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
      const vector<Vector3D>& vertexPositions)
    // This method initializes the halfedge data structure from a raw list of
    // polygons, where each input polygon is specified as a list of vertex indices.
    // The input must describe a manifold, oriented surface, where the orientation
    // of a polygon is determined by the order of vertices in the list. Polygons
    // must have at least three vertices.  Note that there are no special conditions
    // on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
    // the collection of indices have to be contiguous.  Overall, this initializer
    // is designed to be robust but perhaps not incredibly fast (though of course
    // this does not affect the performance of the resulting data structure).  One
    // could also implement faster initializers that handle important special cases
    // (e.g., all triangles, or data that is known to be manifold). Since there are
    // no strong conditions on the indices of polygons, we assume that the list of
    // vertex positions is given in lexicographic order (i.e., that the lowest index
    // appearing in any polygon corresponds to the first entry of the list of
    // positions and so on).
  {
    // define some types, to improve readability
    typedef vector<Index> IndexList;
    typedef IndexList::const_iterator IndexListCIter;
    typedef vector<IndexList> PolygonList;
    typedef PolygonList::const_iterator PolygonListCIter;
    typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
    // corresponding to an edge of an
    // oriented polygon

    // Clear any existing elements.
    halfedges.clear();
    vertices.clear();
    edges.clear();
    faces.clear();
    boundaries.clear();

    // Since the vertices in our halfedge mesh are stored in a linked list,
    // we will temporarily need to keep track of the correspondence between
    // indices of vertices in our input and pointers to vertices in the new
    // mesh (which otherwise can't be accessed by index).  Note that since
    // we're using a general-purpose map (rather than, say, a vector), we can
    // be a bit more flexible about the indexing scheme: input vertex indices
    // aren't required to be 0-based or 1-based; in fact, the set of indices
    // doesn't even have to be contiguous.  Taking advantage of this fact makes
    // our conversion a bit more robust to different types of input, including
    // data that comes from a subset of a full mesh.

    // maps a vertex index to the corresponding vertex
    map<Index, VertexIter> indexToVertex;

    // Also store the vertex degree, i.e., the number of polygons that use each
    // vertex; this information will be used to check that the mesh is manifold.
    map<VertexIter, Size> vertexDegree;

    // First, we do some basic sanity checks on the input.
    for (PolygonListCIter p = polygons.begin(); p != polygons.end(); p++) {
      if (p->size() < 3) {
        // Refuse to build the mesh if any of the polygons have fewer than three
        // vertices.(Note that if we omit this check the code will still
        // constructsomething fairlymeaningful for 1- and 2-point polygons, but
        // enforcing this stricterrequirementon the input will help simplify code
        // further downstream, since it canbe certainit doesn't have to check for
        // these rather degenerate cases.)
        cerr << "Error converting polygons to halfedge mesh: each polygon must "
          "have at least three vertices." << endl;
        exit(1);
      }

      // We want to count the number of distinct vertex indices in this
      // polygon, to make sure it's the same as the number of vertices
      // in the polygon---if they disagree, then the polygon is not valid
      // (or at least, for simplicity we don't handle polygons of this type!).
      set<Index> polygonIndices;

      // loop over polygon vertices
      for (IndexListCIter i = p->begin(); i != p->end(); i++) {
        polygonIndices.insert(*i);

        // allocate one vertex for each new index we encounter
        if (indexToVertex.find(*i) == indexToVertex.end()) {
          VertexIter v = newVertex();
          v->halfedge() =
            halfedges.end();  // this vertex doesn't yet point to any halfedge
          indexToVertex[*i] = v;
          vertexDegree[v] = 1;  // we've now seen this vertex only once
        } else {
          // keep track of the number of times we've seen this vertex
          vertexDegree[indexToVertex[*i]]++;
        }

      }  // end loop over polygon vertices

      // check that all vertices of the current polygon are distinct
      Size degree = p->size();  // number of vertices in this polygon
      if (polygonIndices.size() < degree) {
        cerr << "Error converting polygons to halfedge mesh: one of the input "
          "polygons does not have distinct vertices!" << endl;
        cerr << "(vertex indices:";
        for (IndexListCIter i = p->begin(); i != p->end(); i++) {
          cerr << " " << *i;
        }
        cerr << ")" << endl;
        exit(1);
      }  // end check that polygon vertices are distinct

    }  // end basic sanity checks on input

    // The number of vertices in the mesh is the
    // number of unique indices seen in the input.
    Size nVertices = indexToVertex.size();

    // The number of faces is just the number of polygons in the input.
    Size nFaces = polygons.size();
    faces.resize(nFaces);  // allocate storage for faces in our new mesh

    // We will store a map from ordered pairs of vertex indices to
    // the corresponding halfedge object in our new (halfedge) mesh;
    // this map gets constructed during the next loop over polygons.
    map<IndexPair, HalfedgeIter> pairToHalfedge;

    // Next, we actually build the halfedge connectivity by again looping over
    // polygons
    PolygonListCIter p;
    FaceIter f;
    for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
      vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
      // edges of this face
      Size degree = p->size();             // number of vertices in this polygon

      // loop over the halfedges of this face (equivalently, the ordered pairs of
      // consecutive vertices)
      for (Index i = 0; i < degree; i++) {
        Index a = (*p)[i];                 // current index
        Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
        IndexPair ab(a, b);
        HalfedgeIter hab;

        // check if this halfedge already exists; if so, we have a problem!
        if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
          cerr << "Error converting polygons to halfedge mesh: found multiple "
            "oriented edges with indices (" << a << ", " << b << ")."
            << endl;
          cerr << "This means that either (i) more than two faces contain this "
            "edge (hence the surface is nonmanifold), or" << endl;
          cerr << "(ii) there are exactly two faces containing this edge, but "
            "they have the same orientation (hence the surface is" << endl;
          cerr << "not consistently oriented." << endl;
          exit(1);
        } else  // otherwise, the halfedge hasn't been allocated yet
        {
          // so, we point this vertex pair to a new halfedge
          hab = newHalfedge();
          pairToHalfedge[ab] = hab;

          // link the new halfedge to its face
          hab->face() = f;
          hab->face()->halfedge() = hab;

          // also link it to its starting vertex
          hab->vertex() = indexToVertex[a];
          hab->vertex()->halfedge() = hab;

          // keep a list of halfedges in this face, so that we can later
          // link them together in a loop (via their "next" pointers)
          faceHalfedges.push_back(hab);
        }

        // Also, check if the twin of this halfedge has already been constructed
        // (during construction of a different face).  If so, link the twins
        // together and allocate their shared halfedge.  By the end of this pass
        // over polygons, the only halfedges that will not have a twin will hence
        // be those that sit along the domain boundary.
        IndexPair ba(b, a);
        map<IndexPair, HalfedgeIter>::iterator iba = pairToHalfedge.find(ba);
        if (iba != pairToHalfedge.end()) {
          HalfedgeIter hba = iba->second;

          // link the twins
          hab->twin() = hba;
          hba->twin() = hab;

          // allocate and link their edge
          EdgeIter e = newEdge();
          hab->edge() = e;
          hba->edge() = e;
          e->halfedge() = hab;
        } else { // If we didn't find a twin...
          // ...mark this halfedge as being twinless by pointing
          // it to the end of the list of halfedges. If it remains
          // twinless by the end of the current loop over polygons,
          // it will be linked to a boundary face in the next pass.
          hab->twin() = halfedges.end();
        }

      }  // end loop over the current polygon's halfedges

      // Now that all the halfedges of this face have been allocated,
      // we can link them together via their "next" pointers.
      for (Index i = 0; i < degree; i++) {
        Index j =
          (i + 1) % degree;  // index of the next halfedge, in cyclic order
        faceHalfedges[i]->next() = faceHalfedges[j];
      }

    }  // done building basic halfedge connectivity

    // For each vertex on the boundary, advance its halfedge pointer to one that
    // is also on the boundary.
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
      // loop over halfedges around vertex
      HalfedgeIter h = v->halfedge();
      do {
        if (h->twin() == halfedges.end()) {
          v->halfedge() = h;
          break;
        }

        h = h->twin()->next();
      } while (h != v->halfedge());  // end loop over halfedges around vertex

    }  // done advancing halfedge pointers for boundary vertices

    // Next we construct new faces for each boundary component.
    for (HalfedgeIter h = halfedgesBegin(); h != halfedgesEnd();
        h++)  // loop over all halfedges
    {
      // Any halfedge that does not yet have a twin is on the boundary of the
      // domain. If we follow the boundary around long enough we will of course
      // eventually make a closed loop; we can represent this boundary loop by a
      // new face. To make clear the distinction between faces and boundary loops,
      // the boundary face will (i) have a flag indicating that it is a boundary
      // loop, and (ii) be stored in a list of boundaries, rather than the usual
      // list of faces.  The reason we need the both the flag *and* the separate
      // list is that faces are often accessed in two fundamentally different
      // ways: either by (i) local traversal of the neighborhood of some mesh
      // element using the halfedge structure, or (ii) global traversal of all
      // faces (or boundary loops).
      if (h->twin() == halfedges.end()) {
        FaceIter b = newBoundary();
        vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
        // the boundary, so we can link
        // them together

        // We now need to walk around the boundary, creating new
        // halfedges and edges along the boundary loop as we go.
        HalfedgeIter i = h;
        do {
          // create a twin, which becomes a halfedge of the boundary loop
          HalfedgeIter t = newHalfedge();
          boundaryHalfedges.push_back(
              t);  // keep a list of all boundary halfedges, in cyclic order
          i->twin() = t;
          t->twin() = i;
          t->face() = b;
          t->vertex() = i->next()->vertex();

          // create the shared edge
          EdgeIter e = newEdge();
          e->halfedge() = i;
          i->edge() = e;
          t->edge() = e;

          // Advance i to the next halfedge along the current boundary loop
          // by walking around its target vertex and stopping as soon as we
          // find a halfedge that does not yet have a twin defined.
          i = i->next();
          while (i != h &&  // we're done if we end up back at the beginning of
              // the loop
              i->twin() != halfedges.end())  // otherwise, we're looking for
            // the next twinless halfedge
            // along the loop
          {
            i = i->twin();
            i = i->next();
          }
        } while (i != h);

        b->halfedge() = boundaryHalfedges.front();

        // The only pointers that still need to be set are the "next" pointers of
        // the twins; these we can set from the list of boundary halfedges, but we
        // must use the opposite order from the order in the list, since the
        // orientation of the boundary loop is opposite the orientation of the
        // halfedges "inside" the domain boundary.
        Size degree = boundaryHalfedges.size();
        for (Index p = 0; p < degree; p++) {
          Index q = (p - 1 + degree) % degree;
          boundaryHalfedges[p]->next() = boundaryHalfedges[q];
        }

      }  // end construction of one of the boundary loops

      // Note that even though we are looping over all halfedges, we will still
      // construct the appropriate number of boundary loops (and not, say, one
      // loop per boundary halfedge).  The reason is that as we continue to
      // iterate through halfedges, we check whether their twin has been assigned,
      // and since new twins may have been assigned earlier in this loop, we will
      // end up skipping many subsequent halfedges.

    }  // done adding "virtual" faces corresponding to boundary loops

    // To make later traversal of the mesh easier, we will now advance the
    // halfedge
    // associated with each vertex such that it refers to the *first* non-boundary
    // halfedge, rather than the last one.
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
      v->halfedge() = v->halfedge()->twin()->next();
    }

    // Finally, we check that all vertices are manifold.
    for (VertexIter v = vertices.begin(); v != vertices.end(); v++) {
      // First check that this vertex is not a "floating" vertex;
      // if it is then we do not have a valid 2-manifold surface.
      if (v->halfedge() == halfedges.end()) {
        cerr << "Error converting polygons to halfedge mesh: some vertices are "
          "not referenced by any polygon." << endl;
        exit(1);
      }

      // Next, check that the number of halfedges emanating from this vertex in
      // our half edge data structure equals the number of polygons containing
      // this vertex, which we counted during our first pass over the mesh.  If
      // not, then our vertex is not a "fan" of polygons, but instead has some
      // other (nonmanifold) structure.
      Size count = 0;
      HalfedgeIter h = v->halfedge();
      do {
        if (!h->face()->isBoundary()) {
          count++;
        }
        h = h->twin()->next();
      } while (h != v->halfedge());

      if (count != vertexDegree[v]) {
        cerr << "Error converting polygons to halfedge mesh: at least one of the "
          "vertices is nonmanifold." << endl;
        exit(1);
      }
    }  // end loop over vertices

    // Now that we have the connectivity, we copy the list of vertex
    // positions into member variables of the individual vertices.
    if (vertexPositions.size() < vertices.size()) {
      cerr << "Error converting polygons to halfedge mesh: number of vertex "
        "positions is different from the number of distinct vertices!"
        << endl;
      cerr << "(number of positions in input: " << vertexPositions.size() << ")"
        << endl;
      cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
      exit(1);
    }
    // Since an STL map internally sorts its keys, we can iterate over the map
    // from vertex indices to vertex iterators to visit our (input) vertices in
    // lexicographic order
    int i = 0;
    for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
        e != indexToVertex.end(); e++) {
      // grab a pointer to the vertex associated with the current key (i.e., the
      // current index)
      VertexIter v = e->second;

      // set the att of this vertex to the corresponding
      // position in the input
      v->position = vertexPositions[i];
      v->bindPosition = v->position;
      i++;
    }

  }